

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O1

void Pf_StoDelete(Pf_Man_t *p)

{
  void *pvVar1;
  void **__ptr;
  int *piVar2;
  float *__ptr_00;
  Vec_Wec_t *__ptr_01;
  Vec_Mem_t *pVVar3;
  long lVar4;
  long lVar5;
  
  if (0 < (p->vPages).nSize) {
    lVar4 = 0;
    do {
      pvVar1 = (p->vPages).pArray[lVar4];
      if ((void *)0x2 < pvVar1) {
        free(pvVar1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vPages).nSize);
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar2 = (p->vCutSets).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCutSets).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vCutFlows).pArray;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
    (p->vCutFlows).pArray = (float *)0x0;
  }
  piVar2 = (p->vCutDelays).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  if (p->pPfObjs != (Pf_Obj_t *)0x0) {
    free(p->pPfObjs);
    p->pPfObjs = (Pf_Obj_t *)0x0;
  }
  __ptr_01 = p->vTt2Match;
  if (0 < __ptr_01->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar1 = *(void **)((long)&__ptr_01->pArray->nCap + lVar5);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&__ptr_01->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < __ptr_01->nCap);
  }
  if (__ptr_01->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_01->nCap = 0;
  __ptr_01->nSize = 0;
  free(__ptr_01);
  pVVar3 = p->vTtMem;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    if (pVVar3->vTable != (Vec_Int_t *)0x0) {
      piVar2 = pVVar3->vTable->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar3->vTable->pArray = (int *)0x0;
      }
      if (pVVar3->vTable != (Vec_Int_t *)0x0) {
        free(pVVar3->vTable);
        pVVar3->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
      piVar2 = pVVar3->vNexts->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar3->vNexts->pArray = (int *)0x0;
      }
      if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar3->vNexts);
        pVVar3->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  pVVar3 = p->vTtMem;
  if (-1 < pVVar3->iPage) {
    lVar4 = -1;
    do {
      if (pVVar3->ppPages[lVar4 + 1] != (word *)0x0) {
        free(pVVar3->ppPages[lVar4 + 1]);
        pVVar3->ppPages[lVar4 + 1] = (word *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->iPage);
  }
  if (pVVar3->ppPages != (word **)0x0) {
    free(pVVar3->ppPages);
    pVVar3->ppPages = (word **)0x0;
  }
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    free(pVVar3);
  }
  if (p->pCells != (Mio_Cell_t *)0x0) {
    free(p->pCells);
    p->pCells = (Mio_Cell_t *)0x0;
  }
  if (p != (Pf_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Pf_StoDelete( Pf_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCutSets.pArray );
    ABC_FREE( p->vCutFlows.pArray );
    ABC_FREE( p->vCutDelays.pArray );
    ABC_FREE( p->pPfObjs );
    // matching
    Vec_WecFree( p->vTt2Match );
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pCells );
    ABC_FREE( p );
}